

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.hpp
# Opt level: O2

rational<long_long> tcb::operator/(longlong *lhs,rational<unsigned_int> *rhs)

{
  rational<long_long> rVar1;
  rational<long_long> local_18;
  
  local_18.num_ = (ulong)rhs->denom_ * *lhs;
  local_18.denom_ = (value_type_conflict6)rhs->num_;
  rational<long_long>::simplify(&local_18);
  rVar1.denom_ = local_18.denom_;
  rVar1.num_ = local_18.num_;
  return rVar1;
}

Assistant:

constexpr value_type denom() const { return denom_; }